

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_setclosureroot(HSQUIRRELVM v,SQInteger idx)

{
  SQClosure *this;
  SQObjectPtr *pSVar1;
  SQObjectPtr *pSVar2;
  SQWeakRef *r;
  char *err;
  
  pSVar1 = stack_get(v,idx);
  pSVar2 = SQVM::GetUp(v,-1);
  if ((pSVar1->super_SQObject)._type == OT_CLOSURE) {
    if ((pSVar2->super_SQObject)._type == OT_TABLE) {
      this = (pSVar1->super_SQObject)._unVal.pClosure;
      r = SQRefCounted::GetWeakRef((pSVar2->super_SQObject)._unVal.pRefCounted,OT_TABLE);
      SQClosure::SetRoot(this,r);
      SQVM::Pop(v);
      return 0;
    }
    err = "invalid type";
  }
  else {
    err = "closure expected";
  }
  sq_throwerror(v,err);
  return -1;
}

Assistant:

SQRESULT sq_setclosureroot(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &c = stack_get(v,idx);
    SQObject o = stack_get(v, -1);
    if(!sq_isclosure(c)) return sq_throwerror(v, _SC("closure expected"));
    if(sq_istable(o)) {
        _closure(c)->SetRoot(_table(o)->GetWeakRef(OT_TABLE));
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type"));
}